

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::mouseReleaseEvent(QTextEdit *this,QMouseEvent *e)

{
  byte bVar1;
  long lVar2;
  QWidgetTextControl *pQVar3;
  QWidgetData *pQVar4;
  QWidget *this_00;
  char cVar5;
  bool bVar6;
  LayoutDirection LVar7;
  int iVar8;
  int iVar9;
  TextInteractionFlags TVar10;
  undefined4 uVar11;
  uint uVar12;
  QStyle *pQVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar15 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar16 [16];
  ulong local_48;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar3 = *(QWidgetTextControl **)(lVar2 + 0x2f8);
  LVar7 = QWidget::layoutDirection(*(QWidget **)(lVar2 + 8));
  if (LVar7 == RightToLeft) {
    iVar8 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar2 + 0x288));
    iVar9 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
    iVar8 = iVar8 - iVar9;
  }
  else {
    iVar8 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x288));
  }
  iVar9 = QAbstractSlider::value(*(QAbstractSlider **)(lVar2 + 0x290));
  local_40.yp = (qreal)iVar9;
  local_40.xp = (double)iVar8;
  QWidgetTextControl::processEvent(pQVar3,(QEvent *)e,&local_40,*(QWidget **)(lVar2 + 0x2b0));
  iVar8 = QMouseEvent::source();
  if ((iVar8 == 0) && (*(int *)(lVar2 + 0x308) != 0)) {
    QBasicTimer::stop();
    (**(code **)(**(long **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                       field_0x8 + 0x2f8) + 0x60))();
  }
  pQVar3 = *(QWidgetTextControl **)
            (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
            0x2f8);
  if (pQVar3 != (QWidgetTextControl *)0x0) {
    TVar10 = QWidgetTextControl::textInteractionFlags(pQVar3);
    if (((uint)TVar10.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
      pQVar4 = (this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
      local_40.yp = (qreal)CONCAT44((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i,
                                    (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i);
      local_40.xp = 0.0;
      uVar11 = QEventPoint::position();
      auVar16._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar16._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar16 = minpd(_DAT_0066f5d0,auVar16);
      auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar16._8_8_);
      auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar16._0_8_);
      uVar12 = movmskpd(uVar11,auVar15);
      uVar14 = 0x8000000000000000;
      if ((uVar12 & 1) != 0) {
        uVar14 = (ulong)(uint)(int)auVar16._0_8_ << 0x20;
      }
      local_48 = 0x80000000;
      if ((uVar12 & 2) != 0) {
        local_48 = (ulong)(uint)(int)auVar16._8_8_;
      }
      local_48 = local_48 | uVar14;
      cVar5 = QRect::contains((QPoint *)&local_40,SUB81(&local_48,0));
      if ((cVar5 != '\0') && (*(int *)(e + 0x40) == 1)) {
        bVar1 = *(byte *)(lVar2 + 800);
        this_00 = *(QWidget **)(lVar2 + 8);
        bVar6 = QApplication::autoSipEnabled(QCoreApplication::self);
        if (bVar6) {
          pQVar13 = QWidget::style(this_00);
          iVar8 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x5f,0,this_00,0);
          if (((bVar1 & 0x10) == 0) || (iVar8 == 1)) {
            QGuiApplication::inputMethod();
            QInputMethod::show();
          }
        }
      }
    }
  }
  *(byte *)(lVar2 + 800) = *(byte *)(lVar2 + 800) & 0xef;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->sendControlEvent(e);
    if (e->source() == Qt::MouseEventNotSynthesized && d->autoScrollTimer.isActive()) {
        d->autoScrollTimer.stop();
        ensureCursorVisible();
    }
    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}